

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_match.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseMatch(Parser *this)

{
  bool bVar1;
  Token *pTVar2;
  Position *pos_00;
  Parser *in_RSI;
  undefined1 local_d8 [22];
  undefined2 local_c2;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_c0;
  undefined1 local_b8 [8];
  undefined1 local_b0 [24];
  undefined1 local_98 [8];
  undefined1 local_90 [24];
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> local_78;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> anyCase;
  vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  cases;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_50;
  undefined1 local_48 [8];
  undefined1 local_40 [8];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  undefined1 local_30 [7];
  bool err;
  Position pos;
  Parser *this_local;
  
  pTVar2 = Lexer::getCurrentToken(in_RSI->lexer);
  pos_00 = Token::getPosition(pTVar2);
  Position::Position((Position *)local_30,pos_00);
  sanityExpect(in_RSI,TOK_KW_MATCH);
  expr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._7_1_ = 0;
  parseExpression((Parser *)local_40,(Precedence)in_RSI);
  bVar1 = expect(in_RSI,TOK_EOL);
  if (!bVar1) {
    cases.
    super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 2;
    cases.
    super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0xf;
    pTVar2 = Lexer::getCurrentToken(in_RSI->lexer);
    Token::getPosition(pTVar2);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&local_50,
               (SyntaxErrorCode *)
               ((long)&cases.
                       super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),
               (Position *)
               &cases.
                super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    generateError((Parser *)local_48,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_48)
    ;
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr(&local_50);
  }
  std::
  vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ::vector((vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
            *)&anyCase);
  parseMatchCases(in_RSI,(bool *)((long)&expr._M_t.
                                         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                         .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl
                                 + 7),
                  (vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
                   *)&anyCase);
  std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>::
  unique_ptr<std::default_delete<pfederc::BodyExpr>,void>
            ((unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>> *)&local_78);
  bVar1 = expect(in_RSI,TOK_ANY);
  if (bVar1) {
    bVar1 = expect(in_RSI,TOK_IMPL);
    if (!bVar1) {
      local_90._6_2_ = 2;
      local_90._0_4_ = 0x26;
      pTVar2 = Lexer::getCurrentToken(in_RSI->lexer);
      Token::getPosition(pTVar2);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_90 + 8),(SyntaxErrorCode *)(local_90 + 6),(Position *)local_90);
      generateError((Parser *)(local_90 + 0x10),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_90 + 0x10));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_90 + 8));
    }
    parseFunctionBody((Parser *)local_98);
    std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::operator=
              (&local_78,
               (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_98);
    std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_98);
    bVar1 = expect(in_RSI,TOK_STMT);
    if (!bVar1) {
      local_b0._6_2_ = 2;
      local_b0._0_4_ = 0xc;
      pTVar2 = Lexer::getCurrentToken(in_RSI->lexer);
      Token::getPosition(pTVar2);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_b0 + 8),(SyntaxErrorCode *)(local_b0 + 6),(Position *)local_b0);
      generateError((Parser *)(local_b0 + 0x10),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_b0 + 0x10));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_b0 + 8));
    }
    skipEol(in_RSI);
  }
  bVar1 = expect(in_RSI,TOK_STMT);
  if (!bVar1) {
    local_c2 = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
    local_d8._16_4_ = 0xc;
    pTVar2 = Lexer::getCurrentToken(in_RSI->lexer);
    Token::getPosition(pTVar2);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&local_c0,(SyntaxErrorCode *)&local_c2,(Position *)(local_d8 + 0x10));
    generateError((Parser *)local_b8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_b8)
    ;
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr(&local_c0);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_40);
  if (((!bVar1) ||
      (bVar1 = std::
               vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
               ::empty((vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
                        *)&anyCase), bVar1)) ||
     ((expr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._7_1_ & 1) != 0)) {
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<std::default_delete<pfederc::Expr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0);
  }
  else {
    std::
    make_unique<pfederc::MatchExpr,pfederc::Lexer&,pfederc::Position&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::vector<std::tuple<pfederc::Token_const*,std::vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>,std::allocator<std::tuple<pfederc::Token_const*,std::vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
              ((Lexer *)local_d8,(Position *)in_RSI->lexer,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_30,
               (vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
                *)local_40,&anyCase);
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<pfederc::MatchExpr,std::default_delete<pfederc::MatchExpr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
               (unique_ptr<pfederc::MatchExpr,_std::default_delete<pfederc::MatchExpr>_> *)local_d8)
    ;
    std::unique_ptr<pfederc::MatchExpr,_std::default_delete<pfederc::MatchExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::MatchExpr,_std::default_delete<pfederc::MatchExpr>_> *)local_d8)
    ;
  }
  local_d8._12_4_ = 1;
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            (&local_78);
  std::
  vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ::~vector((vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
             *)&anyCase);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
            ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_40);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseMatch() noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_KW_MATCH);

  bool err = false;

  std::unique_ptr<Expr> expr(parseExpression());
  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
  }

  std::vector<MatchPattern> cases;
  parseMatchCases(err, cases);

  std::unique_ptr<BodyExpr> anyCase;
  if (expect(TokenType::TOK_ANY)) {
    if (!expect(TokenType::TOK_IMPL)) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_EXPECTED_OP_IMPL,
              lexer.getCurrentToken()->getPosition()));
    }

    anyCase = parseFunctionBody();
    if (!expect(TokenType::TOK_STMT)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_EXPECTED_STMT,
            lexer.getCurrentToken()->getPosition()));
    }

    skipEol();
  }

  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_STMT,
          lexer.getCurrentToken()->getPosition()));
  }

  if (!expr || cases.empty() || err)
    return nullptr;

  return std::make_unique<MatchExpr>(lexer, pos, std::move(expr),
      std::move(cases), std::move(anyCase));
}